

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::maybeAmbiguateTypeReference(Parser *this,TypeReferenceSyntax **tyRef)

{
  SyntaxKind SVar1;
  long lVar2;
  ostream *poVar3;
  TypeNameSyntax *pTVar4;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar5;
  AbstractDeclaratorSyntax *pAVar6;
  TypeNameAsTypeReferenceSyntax *pTVar7;
  AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *node;
  AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *ambigTyRef;
  TypeNameAsTypeReferenceSyntax *tyNameAsTyRef;
  TypeNameSyntax *tyName;
  TypedefNameSyntax *tydefName;
  ParenthesizedExpressionSyntax *parenExpr;
  ExpressionAsTypeReferenceSyntax *exprAsTyRef;
  TypeReferenceSyntax **tyRef_local;
  Parser *this_local;
  
  exprAsTyRef = (ExpressionAsTypeReferenceSyntax *)tyRef;
  tyRef_local = (TypeReferenceSyntax **)this;
  SVar1 = C::SyntaxNode::kind(&(*tyRef)->super_SyntaxNode);
  if (SVar1 == ExpressionAsTypeReference) {
    lVar2 = (**(code **)(*(exprAsTyRef->super_TypeReferenceSyntax).super_SyntaxNode.super_Managed.
                          _vptr_Managed + 0x660))();
    SVar1 = C::SyntaxNode::kind(*(SyntaxNode **)(lVar2 + 0x18));
    if (SVar1 == ParenthesizedExpression) {
      parenExpr = (ParenthesizedExpressionSyntax *)
                  (**(code **)(*(exprAsTyRef->super_TypeReferenceSyntax).super_SyntaxNode.
                                super_Managed._vptr_Managed + 0x660))();
      tydefName = (TypedefNameSyntax *)
                  (**(code **)(*(parenExpr->super_ExpressionSyntax).super_MIXIN_GNUExtensionFlag.
                                _vptr_MIXIN_GNUExtensionFlag + 0x3b0))();
      lVar2 = (**(code **)(**(long **)&tydefName[1].super_SpecifierSyntax.super_SyntaxNode.kind_ +
                          0x410))();
      if (lVar2 == 0) {
        return;
      }
      tyName = (TypeNameSyntax *)makeNode<psy::C::TypedefNameSyntax>(this);
      lVar2 = (**(code **)(**(long **)&tydefName[1].super_SpecifierSyntax.super_SyntaxNode.kind_ +
                          0x410))();
      tyName->specs_ = *(SpecifierListSyntax **)(lVar2 + 0x28);
      pTVar4 = makeNode<psy::C::TypeNameSyntax>(this);
      pSVar5 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::TypedefNameSyntax*&>
                         (this,(TypedefNameSyntax **)&tyName);
      pTVar4->specs_ = pSVar5;
      pAVar6 = makeNode<psy::C::AbstractDeclaratorSyntax>(this);
      pTVar4->decltor_ = &pAVar6->super_DeclaratorSyntax;
      pTVar7 = makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
      pTVar7->openParenTkIdx_ = (IndexType)tydefName[1].super_SpecifierSyntax.super_SyntaxNode.tree_
      ;
      pTVar7->typeName_ = pTVar4;
      pTVar7->closeParenTkIdx_ = tydefName[1].identTkIdx_;
      node = makeNode<psy::C::AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>(this);
      (exprAsTyRef->super_TypeReferenceSyntax).super_SyntaxNode.super_Managed._vptr_Managed =
           (_func_int **)node;
      node->exprAsTyRef_ = (ExpressionAsTypeReferenceSyntax *)parenExpr;
      node->tyNameAsTyRef_ = pTVar7;
      DiagnosticsReporter::AmbiguousTypeNameOrExpressionAsTypeReference(&this->diagReporter_,node);
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Common.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::maybeAmbiguateTypeReference(TypeReferenceSyntax*& tyRef)
{
    PSY_ASSERT_3(tyRef->kind() == SyntaxKind::ExpressionAsTypeReference
                    && (tyRef->asExpressionAsTypeReference()->expr_->kind()
                            == SyntaxKind::ParenthesizedExpression),
                  return, "");

    auto exprAsTyRef = tyRef->asExpressionAsTypeReference();
    auto parenExpr = exprAsTyRef->expr_->asParenthesizedExpression();
    if (!parenExpr->expr_->asIdentifierName())
        return;

    auto tydefName = makeNode<TypedefNameSyntax>();
    tydefName->identTkIdx_ = parenExpr->expr_->asIdentifierName()->identTkIdx_;
    auto tyName = makeNode<TypeNameSyntax>();
    tyName->specs_ =  makeNode<SpecifierListSyntax>(tydefName);
    tyName->decltor_ = makeNode<AbstractDeclaratorSyntax>();
    auto tyNameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
    tyNameAsTyRef->openParenTkIdx_ = parenExpr->openParenTkIdx_;
    tyNameAsTyRef->typeName_ = tyName;
    tyNameAsTyRef->closeParenTkIdx_ = parenExpr->closeParenTkIdx_;

    auto ambigTyRef = makeNode<AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>();
    tyRef = ambigTyRef;
    ambigTyRef->exprAsTyRef_ = exprAsTyRef;
    ambigTyRef->tyNameAsTyRef_ = tyNameAsTyRef;

    diagReporter_.AmbiguousTypeNameOrExpressionAsTypeReference(ambigTyRef);
}